

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

pair<long,_bool> __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  int iVar1;
  long in_RAX;
  undefined4 extraout_var;
  ulong in_RDX;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  pair<long,_bool> pVar5;
  locType pos;
  
  iVar1 = this->depth;
  uVar2 = 0;
  if (iVar1 != 0) {
    in_RAX = this->root;
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      iVar1 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])();
      in_RAX = CONCAT44(extraout_var,iVar1);
      in_RDX = (ulong)*(uint *)(in_RAX + 0x640);
      if ((int)*(uint *)(in_RAX + 0x640) < 1) {
        in_RDX = uVar2;
      }
      for (uVar4 = 0; in_RDX != uVar4; uVar4 = uVar4 + 1) {
        if (*key <= *(ulong *)(in_RAX + 0x328 + uVar4 * 8)) {
          iVar1 = this->depth;
          if ((iVar3 < iVar1 + -1) && (*key < *(ulong *)(in_RAX + 0x328 + uVar4 * 8))) {
            in_RDX = uVar4 & 0xffffffff;
          }
          else {
            in_RDX = uVar4 & 0xffffffff;
          }
          goto LAB_0010779c;
        }
      }
      iVar1 = this->depth;
LAB_0010779c:
    }
    iVar1 = (int)in_RDX;
    if ((iVar1 == *(int *)(in_RAX + 0x640)) || (*key < *(ulong *)(in_RAX + 0x328 + (long)iVar1 * 8))
       ) {
      uVar2 = 0;
    }
    else {
      in_RAX = *(long *)(in_RAX + (long)iVar1 * 8);
      uVar2 = 1;
    }
  }
  pVar5._8_8_ = uVar2;
  pVar5.first = in_RAX;
  return pVar5;
}

Assistant:

std::pair<T, bool> find(const Key &key) {
            T ret;
            if (!depth)return std::make_pair(ret, 0);
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(key, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            if (j == x->sz || Compare()(key, x->keyvalue[j]))
                return std::make_pair(ret, false);
            ret = x->val[j];
            return std::make_pair(ret, true);
        }